

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O2

SUNErrCode SUNQRAdd_DCGS2_SB(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  uint nvec;
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  sunrealtype __x;
  double dVar6;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    if (m == 1) {
      N_VDotProdMulti(1,*QRdata,Q,R + mMax);
      lVar2 = (long)mMax;
    }
    else {
      N_VDotProdMultiLocal(m,*QRdata,Q,*(sunrealtype **)((long)QRdata + 0x10));
      nvec = m - 1;
      uVar4 = (ulong)nvec;
      uVar5 = (ulong)(uint)m;
      N_VDotProdMultiLocal
                (nvec,Q[uVar4],Q,(sunrealtype *)(*(long *)((long)QRdata + 0x10) + uVar5 * 8));
      N_VDotProdMultiAllReduce(m * 2 + -1,*QRdata,*(sunrealtype **)((long)QRdata + 0x10));
      lVar1 = *(long *)((long)QRdata + 0x10);
      lVar2 = (long)(mMax * m);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        R[lVar2 + uVar3] = *(sunrealtype *)(lVar1 + uVar3 * 8);
      }
      N_VLinearCombination
                (nvec,(sunrealtype *)(lVar1 + uVar5 * 8),Q,*(N_Vector *)((long)QRdata + 8));
      N_VLinearSum(1.0,Q[uVar4],-1.0,*(N_Vector *)((long)QRdata + 8),Q[uVar4]);
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        R[(long)(int)(nvec * mMax) + uVar3] =
             R[(long)(int)(nvec * mMax) + uVar3] +
             *(double *)(*(long *)((long)QRdata + 0x10) + uVar5 * 8 + uVar3 * 8);
      }
    }
    N_VLinearCombination(m,R + lVar2,Q,*(N_Vector *)((long)QRdata + 8));
    N_VLinearSum(1.0,*QRdata,-1.0,*(N_Vector *)((long)QRdata + 8),*QRdata);
  }
  __x = N_VDotProd(*QRdata,*QRdata);
  dVar6 = 0.0;
  if (0.0 < __x) {
    if (__x < 0.0) {
      dVar6 = sqrt(__x);
    }
    else {
      dVar6 = SQRT(__x);
    }
  }
  R[(mMax + 1) * m] = dVar6;
  N_VScale(1.0 / dVar6,*QRdata,Q[m]);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_DCGS2_SB(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                             int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);
  sunindextype j;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr(); /* temp = df */

  if (m > 0)
  {
    if (m == 1)
    {
      /* R(1:k-1,k) = Q_k-1^T df_aa */
      SUNCheckCall(N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax));
    }
    /* Delayed reorthogonalization */
    else if (m > 1)
    {
      /* R(1:k-1,k) = Q_k-1^T df_aa */
      /* Put R values at beginning of temp array */
      SUNCheckCall(N_VDotProdMultiLocal(m, qrdata->vtemp, Q, qrdata->temp_array));

      /* s = Q_k-2^T Q(:,k-1) */
      SUNCheckCall(
        N_VDotProdMultiLocal(m - 1, Q[m - 1], Q, qrdata->temp_array + m));
      SUNCheckCall(
        N_VDotProdMultiAllReduce(m + m - 1, qrdata->vtemp, qrdata->temp_array));

      /* Move R values to R */
      for (j = 0; j < m; j++) { R[m * mMax + j] = qrdata->temp_array[j]; }

      /* Q(:,k-1) = Q(:,k-1) - Q_k-2 s */
      SUNCheckCall(
        N_VLinearCombination(m - 1, qrdata->temp_array + m, Q, qrdata->vtemp2));
      N_VLinearSum(ONE, Q[m - 1], -ONE, qrdata->vtemp2, Q[m - 1]);
      SUNCheckLastErr();

      /* R(1:k-2,k-1) = R(1:k-2,k-1) + s */
      for (j = 0; j < m - 1; j++)
      {
        R[(m - 1) * mMax + j] = R[(m - 1) * mMax + j] + qrdata->temp_array[m + j];
      }
    }

    /* df = df - Q(:,k-1) R(1:k-1,k) */
    SUNCheckCall(N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2));
    N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    SUNCheckLastErr();
  }

  /* R(k,k) = \| df \| */
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  /* Q(:,k) = df / R(k,k) */
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}